

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O3

void transpose(uint8_t *src,ptrdiff_t pitchSrc,uint8_t *dst,ptrdiff_t pitchDst,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  __m128i r [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (0 < height) {
    uVar16 = 0;
    do {
      if (0 < width) {
        lVar18 = 0;
        puVar20 = dst;
        puVar21 = src;
        do {
          lVar17 = 0;
          puVar19 = puVar21;
          do {
            uVar15 = *(undefined8 *)(puVar19 + 8);
            *(undefined8 *)(local_138 + lVar17) = *(undefined8 *)puVar19;
            *(undefined8 *)(local_138 + lVar17 + 8) = uVar15;
            lVar17 = lVar17 + 0x10;
            puVar19 = puVar19 + pitchSrc;
          } while (lVar17 != 0x100);
          auVar1 = vpunpcklbw_avx(local_138,local_128);
          auVar2 = vpunpcklbw_avx(local_118,local_108);
          auVar3 = vpunpcklbw_avx(local_f8,local_e8);
          auVar4 = vpunpcklbw_avx(local_d8,local_c8);
          auVar9 = vpunpcklwd_avx(auVar1,auVar2);
          auVar10 = vpunpcklwd_avx(auVar3,auVar4);
          auVar12 = vpunpckldq_avx(auVar9,auVar10);
          auVar9 = vpunpckhdq_avx(auVar9,auVar10);
          auVar5 = vpunpcklbw_avx(local_b8,local_a8);
          auVar6 = vpunpcklbw_avx(local_98,local_88);
          auVar7 = vpunpcklbw_avx(local_78,local_68);
          auVar8 = vpunpcklbw_avx(local_58,local_48);
          auVar10 = vpunpcklwd_avx(auVar5,auVar6);
          auVar11 = vpunpcklwd_avx(auVar7,auVar8);
          auVar13 = vpunpckldq_avx(auVar10,auVar11);
          auVar10 = vpunpckhdq_avx(auVar10,auVar11);
          local_238 = vpunpcklqdq_avx(auVar12,auVar13);
          local_228 = vpunpckhqdq_avx(auVar12,auVar13);
          local_218 = vpunpcklqdq_avx(auVar9,auVar10);
          local_208 = vpunpckhqdq_avx(auVar9,auVar10);
          auVar9 = vpunpckhwd_avx(auVar1,auVar2);
          auVar10 = vpunpckhwd_avx(auVar3,auVar4);
          auVar1 = vpunpckhwd_avx(auVar5,auVar6);
          auVar2 = vpunpckhwd_avx(auVar7,auVar8);
          auVar3 = vpunpckldq_avx(auVar9,auVar10);
          auVar9 = vpunpckhdq_avx(auVar9,auVar10);
          auVar4 = vpunpckldq_avx(auVar1,auVar2);
          auVar10 = vpunpckhdq_avx(auVar1,auVar2);
          local_1f8 = vpunpcklqdq_avx(auVar3,auVar4);
          local_1e8 = vpunpckhqdq_avx(auVar3,auVar4);
          local_1d8 = vpunpcklqdq_avx(auVar9,auVar10);
          local_1c8 = vpunpckhqdq_avx(auVar9,auVar10);
          auVar9 = vpunpckhbw_avx(local_138,local_128);
          auVar10 = vpunpckhbw_avx(local_118,local_108);
          auVar1 = vpunpckhbw_avx(local_f8,local_e8);
          auVar2 = vpunpckhbw_avx(local_d8,local_c8);
          auVar3 = vpunpckhbw_avx(local_b8,local_a8);
          auVar4 = vpunpckhbw_avx(local_98,local_88);
          auVar5 = vpunpckhbw_avx(local_78,local_68);
          auVar6 = vpunpckhbw_avx(local_58,local_48);
          auVar7 = vpunpcklwd_avx(auVar9,auVar10);
          auVar8 = vpunpcklwd_avx(auVar1,auVar2);
          auVar11 = vpunpcklwd_avx(auVar3,auVar4);
          auVar12 = vpunpcklwd_avx(auVar5,auVar6);
          auVar13 = vpunpckldq_avx(auVar7,auVar8);
          auVar7 = vpunpckhdq_avx(auVar7,auVar8);
          auVar14 = vpunpckldq_avx(auVar11,auVar12);
          auVar8 = vpunpckhdq_avx(auVar11,auVar12);
          local_1b8 = vpunpcklqdq_avx(auVar13,auVar14);
          local_1a8 = vpunpckhqdq_avx(auVar13,auVar14);
          local_198 = vpunpcklqdq_avx(auVar7,auVar8);
          local_188 = vpunpckhqdq_avx(auVar7,auVar8);
          auVar9 = vpunpckhwd_avx(auVar9,auVar10);
          auVar10 = vpunpckhwd_avx(auVar1,auVar2);
          auVar1 = vpunpckhwd_avx(auVar3,auVar4);
          auVar2 = vpunpckhwd_avx(auVar5,auVar6);
          auVar3 = vpunpckldq_avx(auVar9,auVar10);
          auVar9 = vpunpckhdq_avx(auVar9,auVar10);
          auVar4 = vpunpckldq_avx(auVar1,auVar2);
          auVar10 = vpunpckhdq_avx(auVar1,auVar2);
          local_178 = vpunpcklqdq_avx(auVar3,auVar4);
          local_168 = vpunpckhqdq_avx(auVar3,auVar4);
          local_158 = vpunpcklqdq_avx(auVar9,auVar10);
          local_148 = vpunpckhqdq_avx(auVar9,auVar10);
          lVar17 = 0;
          puVar19 = puVar20;
          do {
            uVar15 = *(undefined8 *)(local_238 + lVar17 + 8);
            *(undefined8 *)puVar19 = *(undefined8 *)(local_238 + lVar17);
            *(undefined8 *)(puVar19 + 8) = uVar15;
            lVar17 = lVar17 + 0x10;
            puVar19 = puVar19 + pitchDst;
          } while (lVar17 != 0x100);
          lVar18 = lVar18 + 0x10;
          puVar21 = puVar21 + pitchSrc * 0x10;
          puVar20 = puVar20 + 0x10;
        } while (lVar18 < width);
      }
      uVar16 = uVar16 + 0x10;
      src = src + 0x10;
      dst = dst + pitchDst * 0x10;
    } while (uVar16 < (uint)height);
  }
  return;
}

Assistant:

static void transpose(const uint8_t *src, ptrdiff_t pitchSrc, uint8_t *dst,
                      ptrdiff_t pitchDst, int width, int height) {
  for (int j = 0; j < height; j += 16)
    for (int i = 0; i < width; i += 16)
      transpose_TX_16X16(src + i * pitchSrc + j, pitchSrc,
                         dst + j * pitchDst + i, pitchDst);
}